

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall QPDF::checkHOutlines(QPDF *this)

{
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> _Var1;
  pointer pcVar2;
  int iVar3;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var4;
  bool bVar5;
  const_iterator cVar6;
  ulong uVar7;
  qpdf_offset_t qVar8;
  long *plVar9;
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *p_Var10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long *plVar14;
  ulong *puVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  long i;
  uint uVar23;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string __str;
  string __str_1;
  ObjUser ou;
  QPDFObjectHandle outlines;
  QPDFObjGen og;
  undefined1 local_118 [32];
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98 [2];
  long local_88 [2];
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  QPDFObjectHandle local_50;
  long local_40;
  QPDFObjGen local_38;
  
  _Var4._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  iVar3 = *(int *)((long)&(_Var4._M_head_impl)->c_outline_data + 0x10);
  if (iVar3 != *(int *)((long)&(_Var4._M_head_impl)->outline_hints + 0x10)) {
    pcVar17 = "incorrect object count in outline hint table";
    sVar19 = 0x2c;
LAB_0021aceb:
    msg._M_str = pcVar17;
    msg._M_len = sVar19;
    linearizationWarning(this,msg);
    return;
  }
  if (iVar3 == 0) {
    return;
  }
  if (((_Var4._M_head_impl)->c_outline_data).first_object !=
      ((_Var4._M_head_impl)->outline_hints).first_object) {
    pcVar17 = "incorrect first object number in outline hints table.";
    sVar19 = 0x35;
    goto LAB_0021aceb;
  }
  getRoot((QPDF *)local_118);
  pcVar2 = local_78 + 0x10;
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"/Outlines","");
  QPDFObjectHandle::getKey(&local_50,(string *)local_118);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if ((Members *)local_118._8_8_ != (Members *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  bVar5 = QPDFObjectHandle::isIndirect(&local_50);
  if (!bVar5) {
    msg_00._M_str = "/Outlines key of root dictionary is not indirect";
    msg_00._M_len = 0x30;
    linearizationWarning(this,msg_00);
    goto LAB_0021b345;
  }
  local_38 = QPDFObjectHandle::getObjGen(&local_50);
  _Var4._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  cVar6 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::find(&((_Var4._M_head_impl)->xref_table)._M_t,&local_38);
  if (cVar6._M_node == (_Base_ptr)((long)&(_Var4._M_head_impl)->xref_table + 8U)) {
    local_78._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"unknown object in outlines hint table","");
    stopOnError(this,(string *)local_78);
    if ((pointer)local_78._0_8_ != pcVar2) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
  }
  uVar7 = getLinearizationOffset(this,local_38);
  local_118._0_8_ = (long)local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"/Outlines","");
  ObjUser::ObjUser((ObjUser *)local_78,ou_root_key,(string *)local_118);
  if (local_118._0_8_ != (long)local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  qVar8 = maxEnd(this,(ObjUser *)local_78);
  i = qVar8 - uVar7;
  if ((int)i != i) {
    QIntC::IntConverter<long_long,_int,_true,_true>::error(i);
  }
  _Var4._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  uVar21 = *(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->outline_hints + 8);
  if (*(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->linp + 0x30) <= (long)uVar21) {
    uVar21 = uVar21 + *(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->linp + 0x38);
  }
  if (uVar7 != uVar21) {
    uVar16 = -uVar21;
    if (0 < (long)uVar21) {
      uVar16 = uVar21;
    }
    uVar18 = 1;
    if (9 < uVar16) {
      uVar13 = uVar16;
      uVar22 = 4;
      do {
        uVar18 = uVar22;
        if (uVar13 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_0021ad24;
        }
        if (uVar13 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_0021ad24;
        }
        if (uVar13 < 10000) goto LAB_0021ad24;
        bVar5 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        uVar22 = uVar18 + 4;
      } while (bVar5);
      uVar18 = uVar18 + 1;
    }
LAB_0021ad24:
    local_98[0] = local_88;
    local_40 = i;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar18 - (char)((long)uVar21 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_98[0] - ((long)uVar21 >> 0x3f)),uVar18,uVar16);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x281a56);
    local_b8 = &local_a8;
    plVar14 = plVar9 + 2;
    if ((long *)*plVar9 == plVar14) {
      local_a8 = *plVar14;
      lStack_a0 = plVar9[3];
    }
    else {
      local_a8 = *plVar14;
      local_b8 = (long *)*plVar9;
    }
    local_b0 = plVar9[1];
    *plVar9 = (long)plVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    puVar15 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar15) {
      local_c8 = *puVar15;
      lStack_c0 = plVar9[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar15;
      local_d8 = (ulong *)*plVar9;
    }
    local_d0 = plVar9[1];
    *plVar9 = (long)puVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    uVar21 = -uVar7;
    if (0 < (long)uVar7) {
      uVar21 = uVar7;
    }
    uVar18 = 1;
    if (9 < uVar21) {
      uVar16 = uVar21;
      uVar22 = 4;
      do {
        uVar18 = uVar22;
        if (uVar16 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_0021ae80;
        }
        if (uVar16 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_0021ae80;
        }
        if (uVar16 < 10000) goto LAB_0021ae80;
        bVar5 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        uVar22 = uVar18 + 4;
      } while (bVar5);
      uVar18 = uVar18 + 1;
    }
LAB_0021ae80:
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar18 - (char)((long)uVar7 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_f8 - ((long)uVar7 >> 0x3f)),uVar18,uVar21);
    i = local_40;
    uVar7 = 0xf;
    if (local_d8 != &local_c8) {
      uVar7 = local_c8;
    }
    if (uVar7 < (ulong)(local_f0 + local_d0)) {
      uVar7 = 0xf;
      if (local_f8 != local_e8) {
        uVar7 = local_e8[0];
      }
      if (uVar7 < (ulong)(local_f0 + local_d0)) goto LAB_0021aefd;
      p_Var10 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_0021aefd:
      p_Var10 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8);
    }
    _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var10 + 2);
    if ((_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)p_Var10->_M_t ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_118._16_8_ =
           *(undefined8 *)
            _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_118._24_8_ = p_Var10[3]._M_t;
      local_118._0_8_ = (long)local_118 + 0x10;
    }
    else {
      local_118._16_8_ =
           *(undefined8 *)
            _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_118._0_8_ =
           (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)p_Var10->_M_t;
    }
    local_118._8_8_ = p_Var10[1]._M_t;
    p_Var10->_M_t =
         _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var10[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(char *)_Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = '\0';
    msg_01._M_str = (char *)local_118._0_8_;
    msg_01._M_len = local_118._8_8_;
    linearizationWarning(this,msg_01);
    if (local_118._0_8_ != (long)local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8,local_e8[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
  }
  uVar18 = *(int *)((long)&((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                           outline_hints + 0x14);
  uVar22 = (uint)i;
  if (uVar18 != uVar22) {
    uVar23 = -uVar18;
    if (0 < (int)uVar18) {
      uVar23 = uVar18;
    }
    uVar20 = 1;
    if (9 < uVar23) {
      uVar7 = (ulong)uVar23;
      uVar12 = 4;
      do {
        uVar20 = uVar12;
        uVar11 = (uint)uVar7;
        if (uVar11 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_0021b064;
        }
        if (uVar11 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_0021b064;
        }
        if (uVar11 < 10000) goto LAB_0021b064;
        uVar7 = uVar7 / 10000;
        uVar12 = uVar20 + 4;
      } while (99999 < uVar11);
      uVar20 = uVar20 + 1;
    }
LAB_0021b064:
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar20 - (char)((int)uVar18 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar18 >> 0x1f) + (long)local_98[0]),uVar20,uVar23);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x281a88);
    local_b8 = &local_a8;
    plVar14 = plVar9 + 2;
    if ((long *)*plVar9 == plVar14) {
      local_a8 = *plVar14;
      lStack_a0 = plVar9[3];
    }
    else {
      local_a8 = *plVar14;
      local_b8 = (long *)*plVar9;
    }
    local_b0 = plVar9[1];
    *plVar9 = (long)plVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    puVar15 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar15) {
      local_c8 = *puVar15;
      lStack_c0 = plVar9[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar15;
      local_d8 = (ulong *)*plVar9;
    }
    local_d0 = plVar9[1];
    *plVar9 = (long)puVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    uVar18 = -uVar22;
    if (0 < (int)uVar22) {
      uVar18 = uVar22;
    }
    uVar23 = 1;
    if (9 < uVar18) {
      uVar7 = (ulong)uVar18;
      uVar20 = 4;
      do {
        uVar23 = uVar20;
        uVar12 = (uint)uVar7;
        if (uVar12 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_0021b1b5;
        }
        if (uVar12 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_0021b1b5;
        }
        if (uVar12 < 10000) goto LAB_0021b1b5;
        uVar7 = uVar7 / 10000;
        uVar20 = uVar23 + 4;
      } while (99999 < uVar12);
      uVar23 = uVar23 + 1;
    }
LAB_0021b1b5:
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct
              ((ulong)&local_f8,(char)uVar23 - ((char)((ulong)i >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar22 >> 0x1f) + (long)local_f8),uVar23,uVar18);
    uVar7 = 0xf;
    if (local_d8 != &local_c8) {
      uVar7 = local_c8;
    }
    if (uVar7 < (ulong)(local_f0 + local_d0)) {
      uVar7 = 0xf;
      if (local_f8 != local_e8) {
        uVar7 = local_e8[0];
      }
      if (uVar7 < (ulong)(local_f0 + local_d0)) goto LAB_0021b224;
      p_Var10 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_0021b224:
      p_Var10 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8);
    }
    local_118._0_8_ = (long)local_118 + 0x10;
    _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var10 + 2);
    if ((_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)p_Var10->_M_t ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_118._16_8_ =
           *(undefined8 *)
            _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_118._24_8_ = p_Var10[3]._M_t;
    }
    else {
      local_118._16_8_ =
           *(undefined8 *)
            _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_118._0_8_ =
           (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)p_Var10->_M_t;
    }
    local_118._8_8_ = p_Var10[1]._M_t;
    p_Var10->_M_t =
         _Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var10[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(char *)_Var1._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = '\0';
    msg_02._M_str = (char *)local_118._0_8_;
    msg_02._M_len = local_118._8_8_;
    linearizationWarning(this,msg_02);
    if ((Members *)local_118._0_8_ != (Members *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8,local_e8[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
LAB_0021b345:
  if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDF::checkHOutlines()
{
    // Empirically, Acrobat generates the correct value for the object number but incorrectly stores
    // the next object number's offset as the offset, at least when outlines appear in part 6.  It
    // also generates an incorrect value for length (specifically, the length that would cover the
    // correct number of objects from the wrong starting place).  pdlin appears to generate correct
    // values in those cases.

    if (m->c_outline_data.nobjects == m->outline_hints.nobjects) {
        if (m->c_outline_data.nobjects == 0) {
            return;
        }

        if (m->c_outline_data.first_object == m->outline_hints.first_object) {
            // Check length and offset.  Acrobat gets these wrong.
            QPDFObjectHandle outlines = getRoot().getKey("/Outlines");
            if (!outlines.isIndirect()) {
                // This case is not exercised in test suite since not permitted by the spec, but if
                // this does occur, the code below would fail.
                linearizationWarning("/Outlines key of root dictionary is not indirect");
                return;
            }
            QPDFObjGen og(outlines.getObjGen());
            if (m->xref_table.count(og) == 0) {
                stopOnError("unknown object in outlines hint table");
            }
            qpdf_offset_t offset = getLinearizationOffset(og);
            ObjUser ou(ObjUser::ou_root_key, "/Outlines");
            int length = toI(maxEnd(ou) - offset);
            qpdf_offset_t table_offset = adjusted_offset(m->outline_hints.first_object_offset);
            if (offset != table_offset) {
                linearizationWarning(
                    "incorrect offset in outlines table: hint table = " +
                    std::to_string(table_offset) + "; computed = " + std::to_string(offset));
            }
            int table_length = m->outline_hints.group_length;
            if (length != table_length) {
                linearizationWarning(
                    "incorrect length in outlines table: hint table = " +
                    std::to_string(table_length) + "; computed = " + std::to_string(length));
            }
        } else {
            linearizationWarning("incorrect first object number in outline hints table.");
        }
    } else {
        linearizationWarning("incorrect object count in outline hint table");
    }
}